

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

void text_data_bss_gaps(LinkedSection **sections)

{
  unsigned_long local_20;
  unsigned_long local_18;
  unsigned_long nextsecbase;
  LinkedSection **sections_local;
  
  if (*sections != (LinkedSection *)0x0) {
    if (sections[1] == (LinkedSection *)0x0) {
      if (sections[2] == (LinkedSection *)0x0) {
        local_20 = 0;
      }
      else {
        local_20 = sections[2]->base;
      }
      local_18 = local_20;
    }
    else {
      local_18 = sections[1]->base;
    }
    if (local_18 != 0) {
      (*sections)->gapsize = local_18 - ((*sections)->base + (*sections)->size);
    }
  }
  if ((sections[1] != (LinkedSection *)0x0) && (sections[2] != (LinkedSection *)0x0)) {
    sections[1]->gapsize = sections[2]->base - (sections[1]->base + sections[1]->filesize);
  }
  return;
}

Assistant:

void text_data_bss_gaps(struct LinkedSection **sections)
/* calculate gap size between text-data and data-bss */
{
  if (sections[0]) {
    unsigned long nextsecbase = sections[1] ? sections[1]->base :
                                (sections[2] ? sections[2]->base : 0);
    if (nextsecbase) {
      sections[0]->gapsize = nextsecbase -
                             (sections[0]->base + sections[0]->size);
    }
  }
  if (sections[1] && sections[2]) {
    sections[1]->gapsize = sections[2]->base -
                           (sections[1]->base + sections[1]->filesize);
  }
}